

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int toLocaleString)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  ulong uVar5;
  bool bVar6;
  JSValue v;
  JSValue v_00;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  int64_t n;
  uint32_t local_74;
  int64_t local_70;
  JSValueUnion local_68;
  JSValueUnion local_60;
  StringBuffer local_58;
  ulong local_38;
  
  local_60.float64 = 0.0;
  JVar7 = JS_ToObject(ctx,this_val);
  JVar2 = JVar7.u;
  iVar1 = js_get_length64(ctx,(int64_t *)&local_38,JVar7);
  if (iVar1 == 0) {
    if ((argc < 1) || (toLocaleString != 0)) {
      local_74 = 0x2c;
      JVar8 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else if ((int)argv->tag == 3) {
      local_74 = 0x2c;
      JVar8 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar8.tag = argv->tag;
      JVar8.u.ptr = (argv->u).ptr;
      JVar8 = JS_ToStringInternal(ctx,JVar8,0);
      local_60 = JVar8.u;
      if ((int)JVar8.tag == 6) goto LAB_00166578;
      if (*(int *)((long)local_60.ptr + 4) == 1) {
        local_74 = (uint32_t)*(byte *)((long)local_60.ptr + 0x10);
      }
      else {
        local_74 = 0xffffffff;
      }
    }
    local_70 = JVar8.tag;
    local_68 = JVar8.u;
    local_58.len = 0;
    local_58.size = 0;
    local_58.is_wide_char = 0;
    local_58.error_status = 0;
    local_58.ctx = ctx;
    local_58.str = js_alloc_string(ctx,0,0);
    if (local_58.str == (JSString *)0x0) {
      local_58._16_8_ = local_58._16_8_ & 0xffffffff;
      local_58.error_status = -1;
    }
    if (0 < (long)local_38) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          if ((int)local_74 < 0) {
            string_buffer_concat
                      (&local_58,(JSString *)local_68.ptr,0,
                       *(uint *)((long)local_68.ptr + 4) & 0x7fffffff);
          }
          else {
            string_buffer_putc8(&local_58,local_74);
          }
        }
        bVar6 = -1 < (int)uVar5;
        JVar3.float64 = (double)(long)(uVar5 & 0xffffffff);
        if (bVar6) {
          JVar3.ptr = (void *)(uVar5 & 0xffffffff);
        }
        iVar4 = 7;
        if (bVar6) {
          iVar4 = 0;
        }
        JVar9.tag = iVar4;
        JVar9.u.float64 = JVar3.float64;
        JVar9 = JS_GetPropertyValue(ctx,JVar7,JVar9);
        if (1 < (int)JVar9.tag - 2U) {
          if ((int)JVar9.tag != 6) {
            if (toLocaleString != 0) {
              JVar9 = JS_ToLocaleStringFree(ctx,JVar9);
            }
            iVar1 = string_buffer_concat_value_free(&local_58,JVar9);
            if (iVar1 == 0) goto LAB_001666ef;
          }
          (*((local_58.ctx)->rt->mf).js_free)(&(local_58.ctx)->rt->malloc_state,local_58.str);
          local_58.str = (JSString *)0x0;
          if ((0xfffffff4 < (uint)JVar8.tag) &&
             (iVar1 = *local_60.ptr, *(int *)local_60.ptr = iVar1 + -1, iVar1 < 2)) {
            v_00.tag = local_70;
            v_00.u.ptr = local_60.ptr;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          goto LAB_00166578;
        }
LAB_001666ef:
        uVar5 = uVar5 + 1;
      } while (local_38 != uVar5);
    }
    if ((0xfffffff4 < (uint)JVar8.tag) &&
       (iVar1 = *local_60.ptr, *(int *)local_60.ptr = iVar1 + -1, iVar1 < 2)) {
      v.tag = local_70;
      v.u.ptr = local_60.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    if ((0xfffffff4 < (uint)JVar7.tag) &&
       (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar7);
    }
    JVar7 = string_buffer_end(&local_58);
  }
  else {
LAB_00166578:
    if ((0xfffffff4 < (uint)JVar7.tag) &&
       (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar7);
    }
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar7;
}

Assistant:

static JSValue js_array_join(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue obj, sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int64_t i, n;
    int c;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &n, obj))
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                string_buffer_putc8(b, c);
            } else {
                string_buffer_concat(b, p, 0, p->len);
            }
        }
        el = JS_GetPropertyUint32(ctx, obj, i);
        if (JS_IsException(el))
            goto fail;
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, obj);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}